

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O3

b_str<char32_t> *
detail::operator|(b_str<char32_t> *__return_storage_ptr__,b_str<char32_t> *str,
                 split_helper_subroutine<detail::get_back,_char32_t,_char32_t> *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  *paVar1;
  size_type sVar2;
  undefined8 uVar3;
  pointer pcVar4;
  size_type sVar5;
  
  pcVar4 = (str->_M_dataplus)._M_p;
  sVar2 = str->_M_string_length;
  if (sVar2 != 0) {
    sVar5 = 0;
    do {
      if (pcVar4[sVar5] == info->delim) {
        if (sVar5 != 0xffffffffffffffff) goto LAB_001a8903;
        break;
      }
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  goto LAB_001a891e;
  while (sVar2 = sVar5 - 1, pcVar4[sVar5 - 1] != info->delim) {
LAB_001a8903:
    sVar5 = sVar2;
    if (sVar5 == 0) break;
  }
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::erase
            (str,0,sVar5);
  pcVar4 = (str->_M_dataplus)._M_p;
LAB_001a891e:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  paVar1 = &str->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)pcVar4 == paVar1) {
    uVar3 = *(undefined8 *)((long)&str->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = str->_M_string_length;
  (str->_M_dataplus)._M_p = (pointer)paVar1;
  str->_M_string_length = 0;
  (str->field_2)._M_local_buf[0] = L'\0';
  return __return_storage_ptr__;
}

Assistant:

b_str<CharType> operator| (b_str<CharType>&& str, const split_helper_subroutine<get_back, DelimType, CharType>& info)
	{
		const auto pos = str.find_first_of(info.delim);
		if (b_str<CharType>::npos != pos) str.erase(0, str.find_last_of(info.delim) + 1);
		return std::move(str);
	}